

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * __thiscall
httplib::detail::make_content_range_header_field_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,size_t offset,size_t length,
          size_t content_length)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  detail *pdVar4;
  size_t sVar5;
  uint uVar6;
  detail *pdVar7;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bytes ","");
  uVar6 = 1;
  if ((detail *)0x9 < this) {
    pdVar7 = this;
    uVar3 = 4;
    do {
      uVar6 = uVar3;
      if (pdVar7 < (detail *)0x64) {
        uVar6 = uVar6 - 2;
        goto LAB_0015ebe4;
      }
      if (pdVar7 < (detail *)0x3e8) {
        uVar6 = uVar6 - 1;
        goto LAB_0015ebe4;
      }
      if (pdVar7 < (detail *)0x2710) goto LAB_0015ebe4;
      bVar2 = (detail *)0x1869f < pdVar7;
      pdVar7 = (detail *)((ulong)pdVar7 / 10000);
      uVar3 = uVar6 + 4;
    } while (bVar2);
    uVar6 = uVar6 + 1;
  }
LAB_0015ebe4:
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)uVar6,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,(unsigned_long)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_50._M_dataplus._M_p,
             CONCAT44(local_50._M_string_length._4_4_,(uint)local_50._M_string_length));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"-");
  pdVar7 = this + (offset - 1);
  uVar6 = 1;
  if ((detail *)0x9 < pdVar7) {
    pdVar4 = pdVar7;
    uVar3 = 4;
    do {
      uVar6 = uVar3;
      if (pdVar4 < (detail *)0x64) {
        uVar6 = uVar6 - 2;
        goto LAB_0015eca4;
      }
      if (pdVar4 < (detail *)0x3e8) {
        uVar6 = uVar6 - 1;
        goto LAB_0015eca4;
      }
      if (pdVar4 < (detail *)0x2710) goto LAB_0015eca4;
      bVar2 = (detail *)0x1869f < pdVar4;
      pdVar4 = (detail *)((ulong)pdVar4 / 10000);
      uVar3 = uVar6 + 4;
    } while (bVar2);
    uVar6 = uVar6 + 1;
  }
LAB_0015eca4:
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)uVar6,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,(unsigned_long)pdVar7);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_50._M_dataplus._M_p,
             CONCAT44(local_50._M_string_length._4_4_,(uint)local_50._M_string_length));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"/");
  uVar6 = 1;
  if (9 < length) {
    sVar5 = length;
    uVar3 = 4;
    do {
      uVar6 = uVar3;
      if (sVar5 < 100) {
        uVar6 = uVar6 - 2;
        goto LAB_0015ed58;
      }
      if (sVar5 < 1000) {
        uVar6 = uVar6 - 1;
        goto LAB_0015ed58;
      }
      if (sVar5 < 10000) goto LAB_0015ed58;
      bVar2 = 99999 < sVar5;
      sVar5 = sVar5 / 10000;
      uVar3 = uVar6 + 4;
    } while (bVar2);
    uVar6 = uVar6 + 1;
  }
LAB_0015ed58:
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)uVar6,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_50._M_dataplus._M_p,
             CONCAT44(local_50._M_string_length._4_4_,(uint)local_50._M_string_length));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_content_range_header_field(size_t offset, size_t length,
                                                   size_t content_length) {
  std::string field = "bytes ";
  field += std::to_string(offset);
  field += "-";
  field += std::to_string(offset + length - 1);
  field += "/";
  field += std::to_string(content_length);
  return field;
}